

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# filemgr.cc
# Opt level: O0

fdb_status
filemgr_close(filemgr *file,bool cleanup_cache_onclose,char *orig_file_name,
             err_log_callback *log_callback)

{
  uint8_t uVar1;
  bool bVar2;
  uint32_t uVar3;
  uint32_t uVar4;
  int iVar5;
  filemgr *pfVar6;
  hash_elem *phVar7;
  hash_elem *phVar8;
  hash *in_RCX;
  char *in_RDX;
  byte in_SIL;
  filemgr *in_RDI;
  hash_elem *ret_1;
  filemgr *old_file;
  filemgr query_old;
  hash_elem *elem_old;
  uint32_t old_file_refcount;
  filemgr query;
  hash_elem *elem;
  hash_elem *ret;
  filemgr *new_file;
  bool foreground_deletion;
  bool need_to_purge_dirty_blocks;
  int rv;
  undefined8 in_stack_fffffffffffff988;
  memory_order mVar9;
  char *log_callback_00;
  atomic<unsigned_int> *in_stack_fffffffffffff990;
  filemgr *file_00;
  undefined4 in_stack_fffffffffffff99c;
  hash *ht;
  undefined4 in_stack_fffffffffffff9a8;
  uint uVar10;
  filemgr *expression;
  char *in_stack_fffffffffffffba8;
  char *in_stack_fffffffffffffbb0;
  fdb_status in_stack_fffffffffffffbbc;
  err_log_callback *in_stack_fffffffffffffbc0;
  filemgr_ops *in_stack_fffffffffffffbc8;
  char *in_stack_fffffffffffffc88;
  uint32_t local_33c;
  fdb_status local_2c;
  
  mVar9 = (memory_order)((ulong)in_stack_fffffffffffff988 >> 0x20);
  local_2c = FDB_RESULT_SUCCESS;
  uVar3 = atomic_decr_uint32_t(in_stack_fffffffffffff990,mVar9);
  if (uVar3 != 0) {
    return FDB_RESULT_SUCCESS;
  }
  uVar10 = 0;
  file_00 = (filemgr *)in_RDI->filename;
  ht = in_RCX;
  uVar3 = atomic_get_uint32_t(in_stack_fffffffffffff990,mVar9);
  log_callback_00 = "Forestdb closed database file %s, ref count %zu";
  expression = file_00;
  fdb_log_impl((err_log_callback *)ht,4,(fdb_status)(ulong)uVar10,
               "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/src/filemgr.cc"
               ,"filemgr_close",0x5c2);
  pthread_spin_lock(&filemgr_openlock);
  pthread_spin_lock(&in_RDI->lock);
  uVar4 = atomic_get_uint32_t((atomic<unsigned_int> *)file_00,
                              (memory_order)((ulong)log_callback_00 >> 0x20));
  if (uVar4 == 0) {
    bVar2 = false;
    if ((global_config.ncacheblock < 1) ||
       (uVar1 = atomic_get_uint8_t((atomic<unsigned_char> *)file_00,
                                   (memory_order)((ulong)log_callback_00 >> 0x20)), uVar1 == '\x04')
       ) {
      pthread_spin_unlock(&in_RDI->lock);
    }
    else {
      pthread_spin_unlock(&in_RDI->lock);
      bVar2 = true;
    }
    iVar5 = wal_is_initialized(in_RDI);
    if (iVar5 != 0) {
      wal_close(file_00,(err_log_callback *)log_callback_00);
    }
    if (bVar2) {
      bcache_remove_dirty_blocks(file_00);
    }
    pthread_spin_lock(&in_RDI->lock);
    uVar1 = atomic_get_uint8_t((atomic<unsigned_char> *)file_00,
                               (memory_order)((ulong)log_callback_00 >> 0x20));
    if (uVar1 == '\x04') {
      bVar2 = false;
      pfVar6 = get_instance_UNLOCKED(in_stack_fffffffffffffc88);
      if (((lazy_file_deletion_enabled & 1U) == 0) ||
         ((pfVar6 != (filemgr *)0x0 && ((pfVar6->in_place_compaction & 1U) != 0)))) {
        local_2c = (*in_RDI->ops->close)(in_RDI->fd);
        _log_errno_str(in_stack_fffffffffffffbc8,in_stack_fffffffffffffbc0,in_stack_fffffffffffffbbc
                       ,in_stack_fffffffffffffbb0,in_stack_fffffffffffffba8);
        bVar2 = true;
      }
      pthread_spin_unlock(&in_RDI->lock);
      phVar7 = hash_remove((hash *)CONCAT44(uVar10,in_stack_fffffffffffff9a8),(hash_elem *)ht);
      if (phVar7 == (hash_elem *)0x0) {
        fdb_assert_die((char *)expression,(char *)CONCAT44(uVar10,in_stack_fffffffffffff9a8),
                       (int)((ulong)ht >> 0x20),CONCAT44(in_stack_fffffffffffff99c,uVar3),
                       (uint64_t)file_00);
      }
      pthread_spin_unlock(&filemgr_openlock);
      if (bVar2) {
        filemgr_free_func((hash_elem *)ht);
      }
      else {
        (*register_file_removal)(in_RDI,(err_log_callback *)in_RCX);
      }
      return local_2c;
    }
    local_2c = (*in_RDI->ops->close)(in_RDI->fd);
    if ((in_SIL & 1) != 0) {
      _log_errno_str(in_stack_fffffffffffffbc8,in_stack_fffffffffffffbc0,in_stack_fffffffffffffbbc,
                     in_stack_fffffffffffffbb0,in_stack_fffffffffffffba8);
      mVar9 = (memory_order)((ulong)log_callback_00 >> 0x20);
      if (((in_RDI->in_place_compaction & 1U) != 0) && (in_RDX != (char *)0x0)) {
        local_33c = 0;
        phVar7 = hash_find(ht,(hash_elem *)CONCAT44(in_stack_fffffffffffff99c,uVar3));
        if ((in_RDI->old_filename != (char *)0x0) &&
           (phVar8 = hash_find(ht,(hash_elem *)CONCAT44(in_stack_fffffffffffff99c,uVar3)),
           phVar8 != (hash_elem *)0x0)) {
          local_33c = atomic_get_uint32_t((atomic<unsigned_int> *)file_00,mVar9);
        }
        if ((((phVar7 == (hash_elem *)0x0) && (local_33c == 0)) &&
            (bVar2 = (*is_file_removed)(in_RDX), bVar2)) &&
           (iVar5 = rename(in_RDI->filename,in_RDX), iVar5 < 0)) {
          _log_errno_str(in_stack_fffffffffffffbc8,in_stack_fffffffffffffbc0,
                         in_stack_fffffffffffffbbc,in_stack_fffffffffffffbb0,
                         in_stack_fffffffffffffba8);
        }
      }
      pthread_spin_unlock(&in_RDI->lock);
      phVar7 = hash_remove((hash *)CONCAT44(uVar10,in_stack_fffffffffffff9a8),(hash_elem *)ht);
      if (phVar7 == (hash_elem *)0x0) {
        fdb_assert_die((char *)expression,(char *)CONCAT44(uVar10,in_stack_fffffffffffff9a8),
                       (int)((ulong)ht >> 0x20),CONCAT44(in_stack_fffffffffffff99c,uVar3),
                       (uint64_t)file_00);
      }
      pthread_spin_unlock(&filemgr_openlock);
      filemgr_free_func((hash_elem *)ht);
      return local_2c;
    }
    atomic_store_uint8_t
              ((atomic<unsigned_char> *)file_00,(uint8_t)((ulong)log_callback_00 >> 0x38),
               (memory_order)log_callback_00);
  }
  _log_errno_str(in_stack_fffffffffffffbc8,in_stack_fffffffffffffbc0,in_stack_fffffffffffffbbc,
                 in_stack_fffffffffffffbb0,in_stack_fffffffffffffba8);
  pthread_spin_unlock(&in_RDI->lock);
  pthread_spin_unlock(&filemgr_openlock);
  return local_2c;
}

Assistant:

fdb_status filemgr_close(struct filemgr *file, bool cleanup_cache_onclose,
                         const char *orig_file_name,
                         err_log_callback *log_callback)
{
    int rv = FDB_RESULT_SUCCESS;

    if (atomic_decr_uint32_t(&file->ref_count) > 0) {
        // File is still accessed by other readers or writers.
        return FDB_RESULT_SUCCESS;
    }

    fdb_log(log_callback, FDB_LOG_INFO, (fdb_status)rv,
            "Forestdb closed database file %s, ref count %zu",
            file->filename,
            atomic_get_uint32_t(&file->ref_count));

    spin_lock(&filemgr_openlock); // Grab the filemgr lock to avoid the race with
                                  // filemgr_open() because file->lock won't
                                  // prevent the race condition.

    // remove filemgr structure if no thread refers to the file
    spin_lock(&file->lock);
    if (atomic_get_uint32_t(&file->ref_count) == 0) {
        bool need_to_purge_dirty_blocks = false;
        if (global_config.ncacheblock > 0 &&
            atomic_get_uint8_t(&file->status) != FILE_REMOVED_PENDING) {
            spin_unlock(&file->lock);
            // discard all dirty blocks belonged to this file
            need_to_purge_dirty_blocks = true;

        } else {
            // If the file is in pending removal (i.e., FILE_REMOVED_PENDING),
            // then its dirty block entries will be cleaned up in either
            // filemgr_free_func() or register_file_removal() below.
            spin_unlock(&file->lock);
        }

        // WARNING: Closing WAL should be done before
        //          purging dirty blocks.
        if (wal_is_initialized(file)) {
            wal_close(file, log_callback);
        }

        if (need_to_purge_dirty_blocks) {
            bcache_remove_dirty_blocks(file);
        }

#ifdef _LATENCY_STATS_DUMP_TO_FILE
        filemgr_dump_latency_stat(file, log_callback);
#endif // _LATENCY_STATS_DUMP_TO_FILE

        spin_lock(&file->lock);

        if (atomic_get_uint8_t(&file->status) == FILE_REMOVED_PENDING) {

            bool foreground_deletion = false;
            struct filemgr* new_file = get_instance_UNLOCKED(file->new_filename);

            // immediately remove file if background remove function is not set
            if (!lazy_file_deletion_enabled ||
                (new_file && new_file->in_place_compaction)) {
                // TODO: to avoid the scenario below, we prevent background
                //       deletion of in-place compacted files at this time.
                // 1) In-place compacted from 'A' to 'A.1'.
                // 2) Request to delete 'A'.
                // 3) Close 'A.1'; since 'A' is not deleted yet, 'A.1' is not renamed.
                // 4) User opens DB file using its original name 'A', not 'A.1'.
                // 5) Old file 'A' is opened, and then background thread deletes 'A'.
                // 6) Crash!

                // As the file is already unlinked, the file will be removed
                // as soon as we close it.
                rv = file->ops->close(file->fd);
                _log_errno_str(file->ops, log_callback, (fdb_status)rv, "CLOSE", file->filename);
#if defined(WIN32) || defined(_WIN32)
                // For Windows, we need to manually remove the file.
                remove(file->filename);
#endif
                foreground_deletion = true;
            }

            // we can release lock becuase no one will open this file
            spin_unlock(&file->lock);
            struct hash_elem *ret = hash_remove(&hash, &file->e);
            fdb_assert(ret, 0, 0);

            spin_unlock(&filemgr_openlock);

            if (foreground_deletion) {
                filemgr_free_func(&file->e);
            } else {
                register_file_removal(file, log_callback);
            }
            return (fdb_status) rv;
        } else {

            rv = file->ops->close(file->fd);
            if (cleanup_cache_onclose) {
                _log_errno_str(file->ops, log_callback, (fdb_status)rv, "CLOSE", file->filename);
                if (file->in_place_compaction && orig_file_name) {
                    struct hash_elem *elem = NULL;
                    struct filemgr query;
                    uint32_t old_file_refcount = 0;

                    query.filename = (char *)orig_file_name;
                    elem = hash_find(&hash, &query.e);

                    if (file->old_filename) {
                        struct hash_elem *elem_old = NULL;
                        struct filemgr query_old;
                        struct filemgr *old_file = NULL;

                        // get old file's ref count if exists
                        query_old.filename = file->old_filename;
                        elem_old = hash_find(&hash, &query_old.e);
                        if (elem_old) {
                            old_file = _get_entry(elem_old, struct filemgr, e);
                            old_file_refcount = atomic_get_uint32_t(&old_file->ref_count);
                        }
                    }

                    // If old file is opened by other handle, renaming should be
                    // postponed. It will be renamed later by the handle referring
                    // to the old file.
                    if (!elem && old_file_refcount == 0 &&
                        is_file_removed(orig_file_name)) {
                        // If background file removal is not done yet, we postpone
                        // file renaming at this time.
                        if (rename(file->filename, orig_file_name) < 0) {
                            // Note that the renaming failure is not a critical
                            // issue because the last compacted file will be automatically
                            // identified and opened in the next fdb_open call.
                            _log_errno_str(file->ops, log_callback, FDB_RESULT_FILE_RENAME_FAIL,
                                           "CLOSE", file->filename);
                        }
                    }
                }
                spin_unlock(&file->lock);
                // Clean up global hash table, WAL index, and buffer cache.
                struct hash_elem *ret = hash_remove(&hash, &file->e);
                fdb_assert(ret, file, 0);

                spin_unlock(&filemgr_openlock);

                filemgr_free_func(&file->e);
                return (fdb_status) rv;
            } else {
                atomic_store_uint8_t(&file->status, FILE_CLOSED);
            }
        }
    }

    _log_errno_str(file->ops, log_callback, (fdb_status)rv, "CLOSE", file->filename);

    spin_unlock(&file->lock);
    spin_unlock(&filemgr_openlock);
    return (fdb_status) rv;
}